

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O2

void __thiscall ui::AboutImpl::AboutImpl(AboutImpl *this)

{
  Ref<ftxui::ButtonOption> option;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  string *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.parent_ = (ComponentBase *)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__AboutImpl_00167650;
  (this->title_)._M_dataplus._M_p = (pointer)&(this->title_).field_2;
  (this->title_)._M_string_length = 0;
  (this->title_).field_2._M_local_buf[0] = '\0';
  this->view_logo = false;
  (this->button_text)._M_dataplus._M_p = (pointer)&(this->button_text).field_2;
  (this->button_text)._M_string_length = 0;
  (this->button_text).field_2._M_local_buf[0] = '\0';
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->opt).border = false;
  std::__cxx11::string::assign((char *)&this->button_text);
  local_68._M_allocated_capacity = (size_type)(local_78 + 0x20);
  local_68._8_8_ = 0;
  local_40._8_8_ = 0;
  local_58[0] = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/about/about_impl.cpp:52:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/about/about_impl.cpp:52:9)>
             ::_M_manager;
  option.address_._0_4_ = *(undefined4 *)&this->opt;
  option._0_8_ = &local_40;
  option.address_._4_4_ = 0;
  local_48 = &this->button_text;
  local_40._M_unused._M_object = this;
  ftxui::Button((ConstStringRef *)local_78,(function<void_()> *)(local_78 + 0x10),option);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)(local_78 + 0x10));
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_88,
             &(this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ftxui::ComponentBase::Add((ComponentBase *)this,(Component *)&_Stack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  return;
}

Assistant:

AboutImpl() {
    opt.border = false;
    button_text = "View Logo";
    viewLogo = Button(
        &button_text,
        [&] {
          view_logo = !view_logo;
          if (view_logo) {
            button_text = "Go Back";
          } else {
            button_text = "View Logo";
          }
        },
        opt);
    Add(viewLogo);
  }